

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O0

void __thiscall
ValueHashTable<ExprHash,_Value_*>::And
          (ValueHashTable<ExprHash,_Value_*> *this,ValueHashTable<ExprHash,_Value_*> *this2)

{
  Value *pVVar1;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  Type_conflict pSVar9;
  Type *pTVar10;
  Type *pTVar11;
  HashBucket *bucket;
  EditingIterator iter;
  Iterator iter2;
  uint i;
  ValueHashTable<ExprHash,_Value_*> *this2_local;
  ValueHashTable<ExprHash,_Value_*> *this_local;
  
  iter2.current._4_4_ = 0;
  do {
    if (this->tableSize <= iter2.current._4_4_) {
      return;
    }
    SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)&iter.last,this2->table + iter2.current._4_4_);
    if (iter2.list ==
        (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
    }
    pNVar3 = iter.last;
    pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)pNVar3,pSVar9);
    if (bVar4) {
      iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   0x0;
    }
    else {
      iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   SListNodeBase<Memory::ArenaAllocator>::Next
                             (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&bucket,this->table + iter2.current._4_4_);
    while (bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&bucket), bVar4) {
      pTVar10 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::Data((Iterator *)&bucket);
      while( true ) {
        bVar5 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                Iterator::IsValid((Iterator *)&iter.last);
        bVar4 = false;
        if (bVar5) {
          uVar6 = ExprHash::operator_cast_to_unsigned_int(&pTVar10->value);
          pTVar11 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                    Iterator::Data((Iterator *)&iter.last);
          uVar7 = ExprHash::operator_cast_to_unsigned_int(&pTVar11->value);
          bVar4 = uVar6 < uVar7;
        }
        if (!bVar4) break;
        if (iter2.list ==
            (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pNVar3 = iter.last;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar9);
        if (bVar4) {
          iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
        }
        else {
          iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)SListNodeBase<Memory::ArenaAllocator>::Next
                                    (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator
              ::IsValid((Iterator *)&iter.last);
      if (bVar4) {
        uVar6 = ExprHash::operator_cast_to_unsigned_int(&pTVar10->value);
        pTVar11 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&iter.last);
        uVar7 = ExprHash::operator_cast_to_unsigned_int(&pTVar11->value);
        if ((uVar6 != uVar7) ||
           (pVVar1 = pTVar10->element,
           pTVar11 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)&iter.last), pVVar1 != pTVar11->element))
        goto LAB_005f79af;
        uVar6 = ExprHash::operator_cast_to_unsigned_int(&pTVar10->value);
        pTVar11 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data((Iterator *)&iter.last);
        uVar7 = ExprHash::operator_cast_to_unsigned_int(&pTVar11->value);
        if ((uVar6 != uVar7) ||
           (pVVar1 = pTVar10->element,
           pTVar10 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)&iter.last), pVVar1 != pTVar10->element)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobHashTable.h"
                             ,0x14a,
                             "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                             ,"Huh??");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        if (iter2.list ==
            (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar8 = 0;
        }
        pNVar3 = iter.last;
        pSVar9 = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar4 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                            *)pNVar3,pSVar9);
        if (bVar4) {
          iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
        }
        else {
          iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)SListNodeBase<Memory::ArenaAllocator>::Next
                                    (&(iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        }
      }
      else {
LAB_005f79af:
        SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator
        ::RemoveCurrent((EditingIterator *)&bucket,&this->alloc->super_ArenaAllocator);
        if (this->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Remove(this->stats,false);
        }
      }
    }
    iter2.current._4_4_ = iter2.current._4_4_ + 1;
  } while( true );
}

Assistant:

void And(ValueHashTable *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<HashBucket>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }